

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O0

void usage(void)

{
  FILE *__stream;
  char *pcVar1;
  
  __stream = _stderr;
  pcVar1 = llbuild::commands::getProgramName();
  fprintf(__stream,"Usage: %s ninja [--help] <command> [<args>]\n",pcVar1);
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Available commands:\n");
  fprintf(_stderr,"  build         -- Build using Ninja manifests\n");
  fprintf(_stderr,"  lex           -- Run the Ninja lexer\n");
  fprintf(_stderr,"  parse         -- Run the Ninja parser\n");
  fprintf(_stderr,"  load-manifest -- Load a Ninja manifest file\n");
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

static void usage() {
  fprintf(stderr, "Usage: %s ninja [--help] <command> [<args>]\n",
          getProgramName());
  fprintf(stderr, "\n");
  fprintf(stderr, "Available commands:\n");
  fprintf(stderr, "  build         -- Build using Ninja manifests\n");
  fprintf(stderr, "  lex           -- Run the Ninja lexer\n");
  fprintf(stderr, "  parse         -- Run the Ninja parser\n");
  fprintf(stderr, "  load-manifest -- Load a Ninja manifest file\n");
  fprintf(stderr, "\n");
  exit(1);
}